

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O2

bool __thiscall hwnet::Poller::Init(Poller *this,ThreadPool *pool)

{
  bool bVar1;
  int iVar2;
  ThreadPool *this_00;
  notifyChannel *__p;
  __shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2> local_48;
  bool local_31 [8];
  bool expected;
  
  this_00 = pool;
  if (pool == (ThreadPool *)0x0) {
    this_00 = (ThreadPool *)operator_new(0xe0);
    ThreadPool::ThreadPool(this_00);
    iVar2 = std::thread::hardware_concurrency();
    ThreadPool::Init(this_00,iVar2 * 2,0);
  }
  local_31[0] = false;
  bVar1 = std::atomic<bool>::compare_exchange_strong
                    (&this->inited,local_31,true,memory_order_seq_cst);
  if (bVar1) {
    this->pool_ = this_00;
    bVar1 = Epoll::Init(&this->poller_);
    if (bVar1) {
      __p = (notifyChannel *)operator_new(0x28);
      (__p->super_enable_shared_from_this<hwnet::Poller::notifyChannel>)._M_weak_this.
      super___weak_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (__p->super_enable_shared_from_this<hwnet::Poller::notifyChannel>)._M_weak_this.
      super___weak_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (__p->super_Channel)._vptr_Channel = (_func_int **)&PTR_OnActive_00123c10;
      std::__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<hwnet::Poller::notifyChannel,void>
                ((__shared_ptr<hwnet::Poller::notifyChannel,(__gnu_cxx::_Lock_policy)2> *)&local_48,
                 __p);
      std::__shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->notifyChannel_).
                  super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>,
                 &local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
      iVar2 = notifyChannel::init((this->notifyChannel_).
                                  super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(EVP_PKEY_CTX *)this);
      if ((char)iVar2 != '\0') {
        this->poolCreateByNew = pool == (ThreadPool *)0x0;
        return true;
      }
      if (pool == (ThreadPool *)0x0) {
        ThreadPool::~ThreadPool(this_00);
        operator_delete(this_00,0xe0);
      }
      this->pool_ = (ThreadPool *)0x0;
      local_48._M_ptr = (element_type *)0x0;
      local_48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->notifyChannel_).
                  super___shared_ptr<hwnet::Poller::notifyChannel,_(__gnu_cxx::_Lock_policy)2>,
                 &local_48);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    }
    else {
      if (pool == (ThreadPool *)0x0) {
        ThreadPool::~ThreadPool(this_00);
        operator_delete(this_00,0xe0);
      }
      this->pool_ = (ThreadPool *)0x0;
    }
  }
  else if (pool == (ThreadPool *)0x0) {
    ThreadPool::~ThreadPool(this_00);
    operator_delete(this_00,0xe0);
  }
  return false;
}

Assistant:

bool Poller::Init(ThreadPool *pool) {

	auto poolCreateByNew_ = false;

	if(nullptr == pool) {
		pool = new ThreadPool;
		pool->Init(std::thread::hardware_concurrency()*2);
		poolCreateByNew_ = true;
	}

	bool expected = false;
	if(!this->inited.compare_exchange_strong(expected,true)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		return false;
	}

	this->pool_ = pool;

	if(!poller_.Init()) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		return false;
	}

	this->notifyChannel_ = notifyChannel::Ptr(new notifyChannel);

	if(!this->notifyChannel_->init(this)) {
		if(poolCreateByNew_) {
			delete pool;
		}
		this->pool_ = nullptr;	
		this->notifyChannel_ = nullptr;
		return false;
	}

	this->poolCreateByNew = poolCreateByNew_;

	return true;	
}